

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

HMBool hypermind::addEntry(Entry *entries,HMUINT32 capacity,Value key,Value value)

{
  Entry *this;
  ValueType VVar1;
  ulong uVar2;
  HMBool HVar3;
  uint uVar4;
  anon_union_8_3_be54641b_for_Value_1 aVar5;
  Value local_40;
  
  aVar5 = key.field_1;
  local_40.type = key.type;
  local_40.field_1 = aVar5;
  if (local_40.type == Object) {
    uVar4 = (**(aVar5.objval)->_vptr_HMObject)(aVar5.objval);
    aVar5._4_4_ = 0;
    aVar5.intval = uVar4;
  }
  do {
    uVar2 = ((ulong)aVar5.objval & 0xffffffff) % (ulong)capacity;
    this = entries + uVar2;
    VVar1 = entries[uVar2].key.type;
    if (VVar1 == Undefined) {
      *(ulong *)&this->key = CONCAT44(local_40._4_4_,local_40.type);
      (this->key).field_1.objval = (HMObject *)local_40.field_1;
      break;
    }
    HVar3 = Value::equals(&this->key,&local_40);
    aVar5.intval = (int)uVar2 + 1;
    aVar5._4_4_ = 0;
  } while (!HVar3);
  (this->value).type = value.type;
  (this->value).field_1 = value.field_1;
  return VVar1 == Undefined;
}

Assistant:

HMBool addEntry(Entry *entries, HMUINT32 capacity, Value key, Value value) {
        uint32_t index = key.hash() % capacity;
        while (true) {
            if (entries[index].key.type == ValueType::Undefined) {
                entries[index].key = key;
                entries[index].value = value;
                return true;       //新的key就返回true
            } else if (entries[index].key.equals(key)) { //key已经存在,仅仅更新值就行
                entries[index].value = value;
                return false;    // 未增加新的key就返回false
            }
            //开放探测定址,尝试下一个slot
            index = (index + 1) % capacity;
        }

    }